

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.h
# Opt level: O2

int __thiscall CVmImageFileExt::dup(CVmImageFileExt *this,int __fd)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 *puVar2;
  
  iVar1 = CVmFile::dup(this->fp_,__fd);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    puVar2 = (undefined8 *)operator_new(0x20);
    *puVar2 = &PTR__CVmImageFileExt_0035f3f8;
    puVar2[1] = CONCAT44(extraout_var,iVar1);
    puVar2[2] = 0;
    puVar2[3] = 0;
  }
  return (int)puVar2;
}

Assistant:

virtual CVmImageFile *dup(const char *mode)
    {
        /* duplicate our file handle */
        CVmFile *fpdup = fp_->dup(mode);
        if (fpdup == 0)
            return 0;

        /* return a new wrapper object for the duplicate handle */
        return new CVmImageFileExt(fpdup);
    }